

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_benchmark_function.hpp
# Opt level: O2

void __thiscall
Catch::Benchmark::Detail::BenchmarkFunction::
model<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svens[P]xxx/xxx/invoke.bench.cpp:101:2)>
::call(model<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_svens[P]xxx_xxx_invoke_bench_cpp:101:2)>
       *this,Chronometer meter)

{
  uint uVar1;
  ulong uVar2;
  ChronometerConcept *pCVar3;
  
  pCVar3 = meter.impl;
  (**pCVar3->_vptr_ChronometerConcept)(pCVar3);
  uVar2 = 0;
  uVar1 = meter.repeats;
  if (meter.repeats < 1) {
    uVar1 = 0;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
  }
  (*pCVar3->_vptr_ChronometerConcept[1])(pCVar3);
  return;
}

Assistant:

void call(Chronometer meter) const override {
                        call(meter, is_callable<Fun(Chronometer)>());
                    }